

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiQueryPhrase(Fts5Context *pCtx,int iPhrase,void *pUserData,
                      _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *xCallback)

{
  bool bVar1;
  Fts5Cursor *local_48;
  Fts5Cursor *pNew;
  Fts5FullTable *pFStack_38;
  int rc;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *xCallback_local;
  void *pUserData_local;
  Fts5Context *pFStack_10;
  int iPhrase_local;
  Fts5Context *pCtx_local;
  
  pFStack_38 = *(Fts5FullTable **)pCtx;
  local_48 = (Fts5Cursor *)0x0;
  pTab = (Fts5FullTable *)pCtx;
  pCsr = (Fts5Cursor *)xCallback;
  xCallback_local = (_func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *)pUserData;
  pUserData_local._4_4_ = iPhrase;
  pFStack_10 = pCtx;
  pNew._4_4_ = fts5OpenMethod(*(sqlite3_vtab **)pCtx,(sqlite3_vtab_cursor **)&local_48);
  if (pNew._4_4_ == 0) {
    local_48->ePlan = 1;
    local_48->iFirstRowid = -0x8000000000000000;
    local_48->iLastRowid = 0x7fffffffffffffff;
    (local_48->base).pVtab = (sqlite3_vtab *)pFStack_38;
    pNew._4_4_ = sqlite3Fts5ExprClonePhrase
                           ((Fts5Expr *)pTab[1].p.base.pModule,pUserData_local._4_4_,
                            &local_48->pExpr);
  }
  if (pNew._4_4_ == 0) {
    pNew._4_4_ = fts5CursorFirst(pFStack_38,local_48,0);
    while( true ) {
      bVar1 = false;
      if (pNew._4_4_ == 0) {
        bVar1 = (local_48->csrflags & 1U) == 0;
      }
      if (!bVar1) goto LAB_0027ea1e;
      pNew._4_4_ = (*(code *)pCsr)(&sFts5Api,local_48,xCallback_local);
      if (pNew._4_4_ != 0) break;
      pNew._4_4_ = fts5NextMethod(&local_48->base);
    }
    if (pNew._4_4_ == 0x65) {
      pNew._4_4_ = 0;
    }
  }
LAB_0027ea1e:
  fts5CloseMethod(&local_48->base);
  return pNew._4_4_;
}

Assistant:

static int fts5ApiQueryPhrase(
  Fts5Context *pCtx, 
  int iPhrase, 
  void *pUserData,
  int(*xCallback)(const Fts5ExtensionApi*, Fts5Context*, void*)
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  int rc;
  Fts5Cursor *pNew = 0;

  rc = fts5OpenMethod(pCsr->base.pVtab, (sqlite3_vtab_cursor**)&pNew);
  if( rc==SQLITE_OK ){
    pNew->ePlan = FTS5_PLAN_MATCH;
    pNew->iFirstRowid = SMALLEST_INT64;
    pNew->iLastRowid = LARGEST_INT64;
    pNew->base.pVtab = (sqlite3_vtab*)pTab;
    rc = sqlite3Fts5ExprClonePhrase(pCsr->pExpr, iPhrase, &pNew->pExpr);
  }

  if( rc==SQLITE_OK ){
    for(rc = fts5CursorFirst(pTab, pNew, 0);
        rc==SQLITE_OK && CsrFlagTest(pNew, FTS5CSR_EOF)==0;
        rc = fts5NextMethod((sqlite3_vtab_cursor*)pNew)
    ){
      rc = xCallback(&sFts5Api, (Fts5Context*)pNew, pUserData);
      if( rc!=SQLITE_OK ){
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        break;
      }
    }
  }

  fts5CloseMethod((sqlite3_vtab_cursor*)pNew);
  return rc;
}